

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sqrti.h
# Opt level: O2

uint32_t sqrti_4(uint32_t x)

{
  uint32_t res;
  uint32_t add;
  uint uVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  
  res = 0;
  uVar1 = 0x8000;
  iVar2 = 0x10;
  while( true ) {
    bVar4 = iVar2 == 0;
    iVar2 = iVar2 + -1;
    if (bVar4) break;
    uVar3 = res | uVar1;
    if (uVar3 * uVar3 <= x) {
      res = uVar3;
    }
    uVar1 = uVar1 >> 1;
  }
  return res;
}

Assistant:

uint32_t sqrti_4(uint32_t x)
{
    uint32_t res = 0;
    uint32_t add = 0x8000;
    uint32_t i;
    for (i = 0; i < 16; i++)
    {
        uint32_t temp = res | add;
        uint32_t g2 = temp;
        g2 *= temp;
        if (x >= g2)
        {
            res = temp;
        }
        add >>= 1;
    }
    return res;
}